

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

unique_ptr<std::thread,_std::default_delete<std::thread>_>
anon_unknown.dwarf_113fb::_create_threaded_window
          (WindowHandle user_data,string *title,int x,int y,int w,int h)

{
  thread *this;
  undefined4 in_register_00000014;
  undefined1 local_50 [8];
  unique_lock<std::mutex> lk;
  int local_2c;
  int local_28;
  int w_local;
  int y_local;
  int x_local;
  string *title_local;
  WindowHandle user_data_local;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> *res;
  
  _y_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000014,x);
  *(undefined1 *)&title[6]._M_string_length = 0;
  local_2c = h;
  local_28 = w;
  w_local = y;
  title_local = title;
  user_data_local = user_data;
  this = (thread *)operator_new(8);
  std::thread::
  thread<void(&)(WindowHandleData*,std::__cxx11::string_const&,int,int,int,int),WindowHandleData*&,std::__cxx11::string_const&,int&,int&,int&,int&,void>
            (this,_create_window_with_message_loop,(WindowHandleData **)&title_local,_y_local,
             &w_local,&local_28,&local_2c,(int *)&stack0x00000008);
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,std::default_delete<std::thread>> *)user_data,this);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_50,(mutex_type *)&title_local[3].field_2);
  if ((title_local[6]._M_string_length & 1) == 0) {
    std::condition_variable::
    wait<(anonymous_namespace)::_create_threaded_window(WindowHandleData*,std::__cxx11::string_const&,int,int,int,int)::__0>
              ((condition_variable *)(title_local[4].field_2._M_local_buf + 8),
               (unique_lock<std::mutex> *)local_50,(anon_class_8_1_29cdea3e)&title_local);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
  return (__uniq_ptr_data<std::thread,_std::default_delete<std::thread>,_true,_true>)
         (__uniq_ptr_data<std::thread,_std::default_delete<std::thread>,_true,_true>)user_data;
}

Assistant:

std::unique_ptr<std::thread> _create_threaded_window(WindowHandle user_data, const std::string& title, int x, int y, int w, int h)
    {
    user_data->initialised = false;
    std::unique_ptr<std::thread> res(new std::thread(_create_window_with_message_loop, user_data, title, x, y, w, h));
    std::unique_lock<std::mutex> lk(user_data->mt);
    if (!user_data->initialised)
      user_data->cv.wait(lk, [&] {return user_data->initialised; });
    return res;
    }